

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

bool duckdb::AllowCommunityExtensionsSetting::OnGlobalReset(DatabaseInstance *db,DBConfig *config)

{
  bool bVar1;
  InvalidInputException *this;
  allocator local_6b9;
  DBConfig local_6b8;
  
  bVar1 = true;
  if ((db != (DatabaseInstance *)0x0) && ((config->options).allow_community_extensions == false)) {
    DBConfig::DBConfig(&local_6b8);
    DBConfig::~DBConfig(&local_6b8);
    if (local_6b8.options.allow_community_extensions == true) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_6b8,
                 "Cannot upgrade allow_community_extensions setting while database is running",
                 &local_6b9);
      InvalidInputException::InvalidInputException(this,(string *)&local_6b8);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AllowCommunityExtensionsSetting::OnGlobalReset(DatabaseInstance *db, DBConfig &config) {
	if (db && !config.options.allow_community_extensions) {
		if (DBConfig().options.allow_community_extensions) {
			throw InvalidInputException("Cannot upgrade allow_community_extensions setting while database is running");
		}
		return false;
	}
	return true;
}